

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O2

void __thiscall
VW::object_pool<example,_example_initializer>::return_object
          (object_pool<example,_example_initializer> *this,example *obj)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  example *local_18;
  
  local_18 = obj;
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->m_lock);
  std::deque<example_*,_std::allocator<example_*>_>::push_back(&(this->m_pool).c,&local_18);
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void return_object(T* obj)
  {
    std::unique_lock<std::mutex> lock(m_lock);
    assert(is_from_pool(obj));
    m_pool.push(obj);
  }